

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O0

IdentPtr __thiscall
HashTbl::PidHashNameLenWithHash<unsigned_char>
          (HashTbl *this,uchar *prgch,uchar *end,int32 cch,uint32 luHash)

{
  code *pcVar1;
  ULONG UVar2;
  bool bVar3;
  ULONG UVar4;
  HRESULT HVar5;
  undefined4 *puVar6;
  ULONG local_50;
  uint local_4c;
  ULONG Len;
  int depth;
  int32 bucketCount;
  LONG cb;
  IdentPtr pid;
  IdentPtr *ppid;
  uint32 luHash_local;
  int32 cch_local;
  uchar *end_local;
  uchar *prgch_local;
  HashTbl *this_local;
  
  ppid._0_4_ = luHash;
  ppid._4_4_ = cch;
  _luHash_local = end;
  end_local = prgch;
  prgch_local = (uchar *)this;
  if (cch < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x104,"(cch >= 0)","cch >= 0");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((ppid._4_4_ != 0) && (end_local == (uchar *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x105,"(cch == 0 || prgch != nullptr)","cch == 0 || prgch != nullptr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  UVar2 = (uint32)ppid;
  UVar4 = CaseSensitiveComputeHash(end_local,_luHash_local);
  if (UVar2 != UVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x106,"(luHash == CaseSensitiveComputeHash(prgch, end))",
                       "luHash == CaseSensitiveComputeHash(prgch, end)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pid = (IdentPtr)0x0;
  local_4c = 0;
  _bucketCount = (HashTbl *)
                 FindExistingPid<unsigned_char>
                           (this,end_local,_luHash_local,ppid._4_4_,(uint32)ppid,(IdentPtr **)&pid,
                            (int32 *)&Len,(int *)&local_4c);
  this_local = _bucketCount;
  if (_bucketCount == (HashTbl *)0x0) {
    if ((5 < Len) && (this->m_luMask < this->m_luCount)) {
      Grow(this);
      for (pid = (IdentPtr)(this->m_prgpidName + ((uint32)ppid & this->m_luMask));
          pid->m_pidNext != (Ident *)0x0; pid = pid->m_pidNext) {
      }
    }
    local_4c = local_4c + 1;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Insert(this->stats,local_4c);
    }
    HVar5 = ULongAdd(ppid._4_4_,1,&local_50);
    if ((((HVar5 < 0) || (HVar5 = ULongMult(local_50,2,&local_50), HVar5 < 0)) ||
        (HVar5 = ULongAdd(local_50,0x28,&local_50), HVar5 < 0)) ||
       (HVar5 = ULongToLong(local_50,&depth), HVar5 < 0)) {
      depth = 0;
      OutOfMemory();
    }
    _bucketCount = (HashTbl *)NoReleaseAllocator::Alloc(&this->m_noReleaseAllocator,depth);
    if (_bucketCount == (HashTbl *)0x0) {
      OutOfMemory();
    }
    pid->m_pidNext = (Ident *)_bucketCount;
    this->m_luCount = this->m_luCount + 1;
    (_bucketCount->m_noReleaseAllocator).m_pblkList = (NraBlock *)0x0;
    *(ushort *)&(_bucketCount->m_noReleaseAllocator).m_cbMinBlock = 0x90;
    *(ushort *)((long)&(_bucketCount->m_noReleaseAllocator).m_cbMinBlock + 2) = 0;
    (_bucketCount->m_noReleaseAllocator).m_cbMaxBlock = (uint32)ppid;
    (_bucketCount->m_noReleaseAllocator).m_cbTotRequested = ppid._4_4_;
    *(PidRefStack **)&(_bucketCount->m_noReleaseAllocator).m_ibCur = (PidRefStack *)0x0;
    (_bucketCount->m_noReleaseAllocator).m_cbTotAlloced = -1;
    *(AssignmentState *)&(_bucketCount->m_noReleaseAllocator).m_cblk = NotAssigned;
    *(bool *)((long)&(_bucketCount->m_noReleaseAllocator).m_cblk + 1) = false;
    CopyString((LPOLESTR)((long)&(_bucketCount->m_noReleaseAllocator).m_cblk + 2),end_local,
               _luHash_local);
    this_local = _bucketCount;
  }
  return (IdentPtr)this_local;
}

Assistant:

IdentPtr HashTbl::PidHashNameLenWithHash(_In_reads_(cch) CharType const * prgch, CharType const * end, int32 cch, uint32 luHash)
{
    Assert(cch >= 0);
    Assert(cch == 0 || prgch != nullptr);
    Assert(luHash == CaseSensitiveComputeHash(prgch, end));

    IdentPtr * ppid = nullptr;
    IdentPtr pid;
    LONG cb;
    int32 bucketCount;


#if PROFILE_DICTIONARY
    int depth = 0;
#endif

    pid = this->FindExistingPid(prgch, end, cch, luHash, &ppid, &bucketCount
#if PROFILE_DICTIONARY
                                , depth
#endif
        );
    if (pid)
    {
        return pid;
    }

    if (bucketCount > BucketLengthLimit && m_luCount > m_luMask)
    {
        Grow();

        // ppid is now invalid because the Grow() moves the entries around.
        // Find the correct ppid by repeating the find of the end of the bucket
        // the new item will be placed in.
        // Note this is similar to the main find loop but does not count nor does it
        // look at the entries because we already proved above the entry is not in the
        // table, we just want to find the end of the bucket.
        ppid = &m_prgpidName[luHash & m_luMask];
        while (*ppid)
            ppid = &(*ppid)->m_pidNext;
    }


#if PROFILE_DICTIONARY
    ++depth;
    if (stats)
        stats->Insert(depth);
#endif

    //Windows OS Bug 1795286 : CENTRAL PREFAST RUN: inetcore\scriptengines\src\src\core\hash.cpp :
    //               'sizeof((*pid))+((cch+1))*sizeof(OLECHAR)' may be smaller than
    //               '((cch+1))*sizeof(OLECHAR)'. This can be caused by integer overflows
    //               or underflows. This could yield an incorrect buffer all
    /* Allocate space for the identifier */
    ULONG Len;

    if (FAILED(ULongAdd(cch, 1, &Len)) ||
        FAILED(ULongMult(Len, sizeof(OLECHAR), &Len)) ||
        FAILED(ULongAdd(Len, sizeof(*pid), &Len)) ||
        FAILED(ULongToLong(Len, &cb)))
    {
        cb = 0;
        OutOfMemory();
    }


    if (nullptr == (pid = (IdentPtr)m_noReleaseAllocator.Alloc(cb)))
        OutOfMemory();

    /* Insert the identifier into the hash list */
    *ppid = pid;

    // Increment the number of entries in the table.
    m_luCount++;

    /* Fill in the identifier record */
    pid->m_pidNext = nullptr;
    pid->m_tk = tkLim;
    pid->m_grfid = fidNil;
    pid->m_luHash = luHash;
    pid->m_cch = cch;
    pid->m_pidRefStack = nullptr;
    pid->m_propertyId = Js::Constants::NoProperty;
    pid->assignmentState = NotAssigned;
    pid->isUsedInLdElem = false;

    HashTbl::CopyString(pid->m_sz, prgch, end);

    return pid;
}